

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall fmt::internal::ArgMap<char>::find(ArgMap<char> *this,BasicStringRef<char> *name)

{
  bool bVar1;
  pointer ppVar2;
  __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  BasicStringRef<char> *name_local;
  ArgMap<char> *this_local;
  
  end = std::
        vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
        ::begin(&this->map_);
  local_30._M_current =
       (pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> *)
       std::
       vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
       ::end(&this->map_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) {
      return (Arg *)0x0;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
             ::operator->(&end);
    bVar1 = fmt::operator==(ppVar2->first,*name);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
    ::operator++(&end);
  }
  ppVar2 = __gnu_cxx::
           __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
           ::operator->(&end);
  return &ppVar2->second;
}

Assistant:

const internal::Arg *find(const fmt::BasicStringRef<Char> &name) const {
    // The list is unsorted, so just return the first matching name.
    for (typename MapType::const_iterator it = map_.begin(), end = map_.end();
         it != end; ++it) {
      if (it->first == name)
        return &it->second;
    }
    return FMT_NULL;
  }